

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
llbuild::core::TaskInterface::spawn
          (TaskInterface *this,QueueJobContext *context,ArrayRef<llvm::StringRef> commandLine,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment,
          ProcessAttributes attributes,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn,
          ProcessDelegate *delegate)

{
  ProcessAttributes PVar1;
  QueueJobContext *pQVar2;
  ExecutionQueue *pEVar3;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> local_b0;
  ProcessAttributes local_88;
  TaskInterface *local_68;
  pair<llvm::StringRef,_llvm::StringRef> *local_60;
  size_type local_58;
  size_type local_50;
  QueueJobContext *local_48;
  QueueJobContext *context_local;
  TaskInterface *this_local;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment_local;
  ArrayRef<llvm::StringRef> commandLine_local;
  
  PVar1 = attributes;
  environment_local.Data = (pair<llvm::StringRef,_llvm::StringRef> *)environment.Length;
  this_local = (TaskInterface *)environment.Data;
  environment_local.Length = (size_type)commandLine.Data;
  local_48 = context;
  context_local = (QueueJobContext *)this;
  pEVar3 = anon_unknown.dwarf_fc19c::BuildEngineImpl::getExecutionQueue
                     ((BuildEngineImpl *)this->impl);
  pQVar2 = local_48;
  local_58 = environment_local.Length;
  local_68 = this_local;
  local_60 = environment_local.Data;
  local_88.canSafelyInterrupt = attributes.canSafelyInterrupt;
  local_88.connectToConsole = attributes.connectToConsole;
  local_88._2_6_ = attributes._2_6_;
  attributes.workingDir.Data = PVar1.workingDir.Data;
  local_88.workingDir.Data = attributes.workingDir.Data;
  attributes.workingDir.Length = PVar1.workingDir.Length;
  local_88.workingDir.Length = attributes.workingDir.Length;
  attributes._24_8_ = PVar1._24_8_;
  local_88.inheritEnvironment = attributes.inheritEnvironment;
  local_88.controlEnabled = attributes.controlEnabled;
  local_88._26_6_ = attributes._26_6_;
  local_50 = commandLine.Length;
  llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::Optional
            (&local_b0,completionFn);
  (*pEVar3->_vptr_ExecutionQueue[4])
            (pEVar3,pQVar2,local_58,local_50,local_68,local_60,local_88._0_8_,
             local_88.workingDir.Data,local_88.workingDir.Length,local_88._24_8_,&local_b0,delegate)
  ;
  llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::~Optional(&local_b0);
  return;
}

Assistant:

void TaskInterface::spawn(basic::QueueJobContext *context,
                          ArrayRef<StringRef> commandLine,
                          ArrayRef<std::pair<StringRef, StringRef> > environment,
                          basic::ProcessAttributes attributes,
                          llvm::Optional<basic::ProcessCompletionFn> completionFn,
                          basic::ProcessDelegate* delegate) {
  static_cast<BuildEngineImpl*>(impl)->getExecutionQueue().executeProcess(
    context, commandLine, environment, attributes, completionFn, delegate);
}